

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

int Bmc_ChainTest(Gia_Man_t *p,int nFrameMax,int nConfMax,int fVerbose,int fVeryVerbose,
                 Vec_Ptr_t **pvCexes)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Cex_t *p_00;
  abctime aVar7;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  abctime aVar8;
  Vec_Ptr_t *local_a0;
  uint local_8c;
  int nNonConst;
  int DepthTotal;
  abctime clkSwp;
  abctime clkCln;
  abctime clkSat;
  abctime clkMov;
  abctime clkBmc;
  abctime clk;
  abctime clk2;
  Vec_Int_t *vOutputs;
  Abc_Cex_t *pCex;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  int IterMax;
  int Iter;
  Vec_Ptr_t **pvCexes_local;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nConfMax_local;
  int nFrameMax_local;
  Gia_Man_t *p_local;
  
  pCex = (Abc_Cex_t *)Gia_ManDup(p);
  aVar5 = Abc_Clock();
  clkMov = 0;
  clkSat = 0;
  clkCln = 0;
  clkSwp = 0;
  local_8c = 0;
  if (pvCexes != (Vec_Ptr_t **)0x0) {
    pVVar6 = Vec_PtrAlloc(1000);
    *pvCexes = pVVar6;
  }
  pTemp._4_4_ = 0;
  do {
    if (9999 < (int)pTemp._4_4_) {
LAB_006deac7:
      iVar1 = Gia_ManPoNum((Gia_Man_t *)pCex);
      iVar3 = Gia_ManCountNonConst0((Gia_Man_t *)pCex);
      uVar4 = Gia_ManPoNum((Gia_Man_t *)pCex);
      printf("Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ",
             (ulong)pTemp._4_4_,(ulong)local_8c,(ulong)(uint)(iVar1 - iVar3),(ulong)uVar4);
      if (fVerbose != 0) {
        aVar8 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar8 - aVar5);
        aVar8 = Abc_Clock();
        Abc_PrintTimeP(1,"BMC  ",clkMov,aVar8 - aVar5);
        aVar8 = Abc_Clock();
        Abc_PrintTimeP(1,"Init ",clkSat,aVar8 - aVar5);
        aVar8 = Abc_Clock();
        Abc_PrintTimeP(1,"SAT  ",clkCln,aVar8 - aVar5);
        aVar8 = Abc_Clock();
        Abc_PrintTimeP(1,"Clean",clkSwp,aVar8 - aVar5);
      }
      Gia_ManStop((Gia_Man_t *)pCex);
      if (pvCexes != (Vec_Ptr_t **)0x0) {
        uVar4 = Vec_PtrSize(*pvCexes);
        printf("Total number of CEXes collected = %d.\n",(ulong)uVar4);
      }
      return 0;
    }
    iVar1 = Gia_ManPoNum((Gia_Man_t *)pCex);
    if (iVar1 == 0) {
      if (fVerbose != 0) {
        printf("Finished all POs.\n");
      }
      goto LAB_006deac7;
    }
    aVar8 = Abc_Clock();
    p_00 = Bmc_ChainFailOneOutput((Gia_Man_t *)pCex,nFrameMax,nConfMax,fVerbose,fVeryVerbose);
    aVar7 = Abc_Clock();
    clkMov = (aVar7 - aVar8) + clkMov;
    if (p_00 == (Abc_Cex_t *)0x0) {
      if (fVerbose != 0) {
        printf("BMC could not detect a failed output in %d frames with %d conflicts.\n",
               (ulong)(uint)nFrameMax,(ulong)(uint)nConfMax);
      }
      goto LAB_006deac7;
    }
    if ((pTemp._4_4_ != 0) && (p_00->iFrame < 1)) {
      __assert_fail("!Iter || pCex->iFrame > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x14c,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
    }
    aVar8 = Abc_Clock();
    p_01 = Gia_ManVerifyCexAndMove((Gia_Man_t *)pCex,p_00);
    Gia_ManStop((Gia_Man_t *)pCex);
    local_8c = p_00->iFrame + local_8c;
    aVar7 = Abc_Clock();
    clkSat = (aVar7 - aVar8) + clkSat;
    aVar8 = Abc_Clock();
    if (pvCexes == (Vec_Ptr_t **)0x0) {
      local_a0 = (Vec_Ptr_t *)0x0;
    }
    else {
      local_a0 = *pvCexes;
    }
    p_02 = Bmc_ChainFindFailedOutputs(p_01,local_a0);
    iVar1 = Vec_IntFind(p_02,p_00->iPo);
    if (iVar1 < 0) {
      __assert_fail("Vec_IntFind(vOutputs, pCex->iPo) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x156,"int Bmc_ChainTest(Gia_Man_t *, int, int, int, int, Vec_Ptr_t **)");
    }
    if (pvCexes == (Vec_Ptr_t **)0x0) {
      Abc_CexFree(p_00);
    }
    else {
      Vec_PtrPush(*pvCexes,p_00);
    }
    aVar7 = Abc_Clock();
    clkCln = (aVar7 - aVar8) + clkCln;
    aVar8 = Abc_Clock();
    pCex = (Abc_Cex_t *)Bmc_ChainCleanup(p_01,p_02);
    Gia_ManStop(p_01);
    aVar7 = Abc_Clock();
    clkSwp = (aVar7 - aVar8) + clkSwp;
    Abc_Clock();
    Abc_Clock();
    if (fVerbose != 0) {
      uVar4 = Gia_ManCountNonConst0((Gia_Man_t *)pCex);
      printf("Iter %4d : ",(ulong)(pTemp._4_4_ + 1));
      printf("Depth =%5d  ",(ulong)local_8c);
      uVar2 = Vec_IntSize(p_02);
      printf("FailPo =%5d  ",(ulong)uVar2);
      printf("UndecPo =%5d ",(ulong)uVar4);
      iVar1 = Gia_ManPoNum((Gia_Man_t *)pCex);
      printf("(%6.2f %%)  ",((double)(int)uVar4 * 100.0) / (double)iVar1);
      uVar4 = Gia_ManAndNum((Gia_Man_t *)pCex);
      printf("AIG =%8d  ",(ulong)uVar4);
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar8 - aVar5);
    }
    Vec_IntFree(p_02);
    pTemp._4_4_ = pTemp._4_4_ + 1;
  } while( true );
}

Assistant:

int Bmc_ChainTest( Gia_Man_t * p, int nFrameMax, int nConfMax, int fVerbose, int fVeryVerbose, Vec_Ptr_t ** pvCexes )
{
    int Iter, IterMax = 10000;
    Gia_Man_t * pTemp, * pNew = Gia_ManDup(p);
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOutputs;
    abctime clk2, clk = Abc_Clock(); 
    abctime clkBmc = 0;
    abctime clkMov = 0;
    abctime clkSat = 0;
    abctime clkCln = 0;
    abctime clkSwp = 0;
    int DepthTotal = 0;
    if ( pvCexes )
        *pvCexes = Vec_PtrAlloc( 1000 );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        if ( Gia_ManPoNum(pNew) == 0 )
        {
            if ( fVerbose )
                printf( "Finished all POs.\n" );
            break;
        }
        // run BMC till the first failure
        clk2 = Abc_Clock(); 
        pCex = Bmc_ChainFailOneOutput( pNew, nFrameMax, nConfMax, fVerbose, fVeryVerbose );
        clkBmc += Abc_Clock() - clk2;
        if ( pCex == NULL )
        {
            if ( fVerbose )
                printf( "BMC could not detect a failed output in %d frames with %d conflicts.\n", nFrameMax, nConfMax );
            break;
        }
        assert( !Iter || pCex->iFrame > 0 );
        // move the AIG to the failure state
        clk2 = Abc_Clock(); 
        pNew = Gia_ManVerifyCexAndMove( pTemp = pNew, pCex );
        Gia_ManStop( pTemp );
        DepthTotal += pCex->iFrame;
        clkMov += Abc_Clock() - clk2;
        // find outputs that fail in this state
        clk2 = Abc_Clock(); 
        vOutputs = Bmc_ChainFindFailedOutputs( pNew, pvCexes ? *pvCexes : NULL );
        assert( Vec_IntFind(vOutputs, pCex->iPo) >= 0 );
        // save the counter-example
        if ( pvCexes )
            Vec_PtrPush( *pvCexes, pCex );
        else
            Abc_CexFree( pCex );
        clkSat += Abc_Clock() - clk2;
        // remove them from the AIG 
        clk2 = Abc_Clock(); 
        pNew = Bmc_ChainCleanup( pTemp = pNew, vOutputs );
        Gia_ManStop( pTemp );
        clkCln += Abc_Clock() - clk2;
        // perform sequential cleanup
        clk2 = Abc_Clock(); 
//        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 0, 1, 0 );
//        Gia_ManStop( pTemp );
        clkSwp += Abc_Clock() - clk2;
        // printout
        if ( fVerbose )
        {
            int nNonConst = Gia_ManCountNonConst0(pNew);
            printf( "Iter %4d : ",    Iter+1 );
            printf( "Depth =%5d  ",   DepthTotal );
            printf( "FailPo =%5d  ",  Vec_IntSize(vOutputs) );
            printf( "UndecPo =%5d ",  nNonConst );
            printf( "(%6.2f %%)  ",   100.0 * nNonConst / Gia_ManPoNum(pNew) );
            printf( "AIG =%8d  ",     Gia_ManAndNum(pNew) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        Vec_IntFree( vOutputs );
    }
    printf( "Completed a CEX chain with %d segments, %d frames, and %d failed POs (out of %d). ", 
        Iter, DepthTotal, Gia_ManPoNum(pNew) - Gia_ManCountNonConst0(pNew), Gia_ManPoNum(pNew) );
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "BMC  ", clkBmc, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Init ", clkMov, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "SAT  ", clkSat, Abc_Clock() - clk );
    Abc_PrintTimeP( 1, "Clean", clkCln, Abc_Clock() - clk );
//    Abc_PrintTimeP( 1, "Sweep", clkSwp, Abc_Clock() - clk );
    }
    Gia_ManStop( pNew );
    if ( pvCexes )
        printf( "Total number of CEXes collected = %d.\n", Vec_PtrSize(*pvCexes) );
    return 0;
}